

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memstream.c
# Opt level: O2

ktx_error_code_e ktxMemStream_read(ktxStream *str,void *dst,ktx_size_t count)

{
  ulong uVar1;
  ktxMem *pkVar2;
  long lVar3;
  ktx_error_code_e kVar4;
  ktx_uint8_t *pkVar5;
  
  kVar4 = KTX_INVALID_VALUE;
  if ((str != (ktxStream *)0x0) &&
     (pkVar2 = (str->data).mem, kVar4 = KTX_INVALID_VALUE, pkVar2 != (ktxMem *)0x0)) {
    lVar3 = pkVar2->pos;
    uVar1 = lVar3 + count;
    kVar4 = KTX_FILE_UNEXPECTED_EOF;
    if ((lVar3 <= (long)uVar1) && (uVar1 <= pkVar2->used_size)) {
      pkVar5 = pkVar2->robytes;
      if (pkVar5 == (ktx_uint8_t *)0x0) {
        pkVar5 = pkVar2->bytes;
      }
      memcpy(dst,pkVar5 + lVar3,count);
      pkVar2->pos = uVar1;
      kVar4 = KTX_SUCCESS;
    }
  }
  return kVar4;
}

Assistant:

static
KTX_error_code ktxMemStream_read(ktxStream* str, void* dst, const ktx_size_t count)
{
    ktxMem* mem;
    ktx_off_t newpos;
    const ktx_uint8_t* bytes;


    if (!str || (mem = str->data.mem)== 0)
        return KTX_INVALID_VALUE;

    newpos = mem->pos + count;
    /* The first clause checks for overflow. */
    if (newpos < mem->pos || (ktx_size_t)newpos > mem->used_size)
        return KTX_FILE_UNEXPECTED_EOF;

    bytes = mem->robytes ? mem->robytes : mem->bytes;
    memcpy(dst, bytes + mem->pos, count);
    mem->pos = newpos;

    return KTX_SUCCESS;
}